

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AutoLoadExtensions(sqlite3 *db)

{
  bool bVar1;
  int err_code;
  void *in_RAX;
  sqlite3_mutex *psVar2;
  uint uVar3;
  code *pcVar4;
  char *zErrmsg;
  void *local_38;
  
  if (sqlite3Autoext_0 != 0) {
    uVar3 = 0;
    local_38 = in_RAX;
    do {
      if (sqlite3Config.bCoreMutex == 0) {
        psVar2 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      }
      if (psVar2 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar2);
      }
      if (sqlite3Autoext_0 <= uVar3) {
        pcVar4 = (code *)0x0;
      }
      else {
        pcVar4 = *(code **)(sqlite3Autoext_1 + (ulong)uVar3 * 8);
      }
      bVar1 = sqlite3Autoext_0 > uVar3;
      if (psVar2 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar2);
      }
      local_38 = (void *)0x0;
      if ((pcVar4 != (code *)0x0) &&
         (err_code = (*pcVar4)(db,&local_38,&sqlite3Apis), err_code != 0)) {
        bVar1 = false;
        sqlite3ErrorWithMsg(db,err_code,"automatic extension loading failed: %s",local_38);
      }
      sqlite3_free(local_38);
      uVar3 = uVar3 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AutoLoadExtensions(sqlite3 *db){
  u32 i;
  int go = 1;
  int rc;
  sqlite3_loadext_entry xInit;

  wsdAutoextInit;
  if( wsdAutoext.nExt==0 ){
    /* Common case: early out without every having to acquire a mutex */
    return;
  }
  for(i=0; go; i++){
    char *zErrmsg;
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
#ifdef SQLITE_OMIT_LOAD_EXTENSION
    const sqlite3_api_routines *pThunk = 0;
#else
    const sqlite3_api_routines *pThunk = &sqlite3Apis;
#endif
    sqlite3_mutex_enter(mutex);
    if( i>=wsdAutoext.nExt ){
      xInit = 0;
      go = 0;
    }else{
      xInit = (sqlite3_loadext_entry)wsdAutoext.aExt[i];
    }
    sqlite3_mutex_leave(mutex);
    zErrmsg = 0;
    if( xInit && (rc = xInit(db, &zErrmsg, pThunk))!=0 ){
      sqlite3ErrorWithMsg(db, rc,
            "automatic extension loading failed: %s", zErrmsg);
      go = 0;
    }
    sqlite3_free(zErrmsg);
  }
}